

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optionmenu.cpp
# Opt level: O3

void __thiscall DGLTextureGLOptions::Drawer(DGLTextureGLOptions *this)

{
  int iVar1;
  BYTE *string;
  FOptionMenuDescriptor *pFVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  
  DOptionMenu::Drawer(&this->super_DOptionMenu);
  if (((0 < gl_texture_hqresize_textures.Value) || (0 < gl_texture_hqresize_sprites.Value)) &&
     (gl_precache.Value == false)) {
    iVar4 = 2;
    lVar5 = 0;
    do {
      string = *(BYTE **)((long)Drawer::HINT_TEXT + lVar5);
      iVar1 = (screen->super_DSimpleCanvas).super_DCanvas.Width;
      iVar3 = FFont::StringWidth(SmallFont,string);
      pFVar2 = (this->super_DOptionMenu).mDesc;
      DCanvas::DrawText((DCanvas *)screen,SmallFont,OptionSettings.mFontColor,
                        (iVar1 - iVar3 * CleanXfac_1) / 2,
                        (((pFVar2->mItems).super_TArray<FOptionMenuItem_*,_FOptionMenuItem_*>.Count
                         + iVar4) * OptionSettings.mLinespacing +
                        (BigFont->FontHeight - pFVar2->mPosition)) * CleanYfac_1,(char *)string,
                        0x40001394,1,0);
      lVar5 = lVar5 + 8;
      iVar4 = iVar4 + 1;
    } while (lVar5 != 0x18);
  }
  return;
}

Assistant:

virtual void Drawer()
	{
		Super::Drawer();

		EXTERN_CVAR(Int, gl_texture_hqresize_textures);
		EXTERN_CVAR(Int, gl_texture_hqresize_sprites);
		EXTERN_CVAR(Bool, gl_precache);

		if ((   gl_texture_hqresize_textures > 0
			 || gl_texture_hqresize_sprites  > 0)
				&& !gl_precache)
		{
			static const char* const HINT_TEXT[] =
			{
				"Consider to turn on",
				"'Precache GL textures' option",
				"to avoid stuttering during play"
			};

			for (size_t i = 0; i < sizeof HINT_TEXT / sizeof HINT_TEXT[0]; ++i)
			{
				const char* const text = HINT_TEXT[i];

				const int x = (screen->GetWidth() - SmallFont->StringWidth(text) * CleanXfac_1) / 2;
				const int y = ((-mDesc->mPosition + BigFont->GetHeight())
					+ OptionSettings.mLinespacing * (mDesc->mItems.Size() + 2 + i)) * CleanYfac_1;

				screen->DrawText(SmallFont, OptionSettings.mFontColor,
					x, y, text, DTA_CleanNoMove_1, true, TAG_DONE);
			}
		}
	}